

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

If_LibBox_t * If_LibBoxStart(void)

{
  If_LibBox_t *pIVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  pIVar1 = (If_LibBox_t *)calloc(1,0x10);
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pIVar1->vBoxes = pVVar2;
  return pIVar1;
}

Assistant:

If_LibBox_t * If_LibBoxStart()
{
    If_LibBox_t * p;
    p = ABC_CALLOC( If_LibBox_t, 1 );
    p->vBoxes = Vec_PtrAlloc( 100 );
    return p;
}